

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O3

void __thiscall
duckdb::StandardColumnWriter<unsigned_long,_unsigned_long,_duckdb::ParquetCastOperator>::
FlushDictionary(StandardColumnWriter<unsigned_long,_unsigned_long,_duckdb::ParquetCastOperator>
                *this,PrimitiveColumnWriterState *state_p,ColumnWriterStatistics *stats)

{
  pointer num_entries;
  ParquetBloomFilter *this_00;
  pointer *__ptr;
  undefined1 local_58 [24];
  function<void_(const_unsigned_long_&,_const_unsigned_long_&)> local_40;
  
  num_entries = state_p[1].super_ColumnWriterState.repetition_levels.
                super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                super__Vector_impl_data._M_finish;
  local_58._8_8_ =
       ((this->super_PrimitiveColumnWriter).super_ColumnWriter.writer)->
       bloom_filter_false_positive_ratio;
  local_58._16_8_ = stats;
  this_00 = (ParquetBloomFilter *)operator_new(0x10);
  ParquetBloomFilter::ParquetBloomFilter(this_00,(idx_t)num_entries,(double)local_58._8_8_);
  ::std::
  __uniq_ptr_impl<duckdb::ParquetBloomFilter,_std::default_delete<duckdb::ParquetBloomFilter>_>::
  reset((__uniq_ptr_impl<duckdb::ParquetBloomFilter,_std::default_delete<duckdb::ParquetBloomFilter>_>
         *)&state_p->bloom_filter,this_00);
  local_40.super__Function_base._M_functor._M_unused._0_8_ = (undefined8)(local_58 + 0x10);
  local_40._M_invoker =
       ::std::
       _Function_handler<void_(const_unsigned_long_&,_const_unsigned_long_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/extension/parquet/include/writer/templated_column_writer.hpp:290:34)>
       ::_M_invoke;
  local_40.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(const_unsigned_long_&,_const_unsigned_long_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/extension/parquet/include/writer/templated_column_writer.hpp:290:34)>
       ::_M_manager;
  local_40.super__Function_base._M_functor._8_8_ = state_p;
  PrimitiveDictionary<unsigned_long,_unsigned_long,_duckdb::ParquetCastOperator>::
  IterateValues<unsigned_long,_0>
            ((PrimitiveDictionary<unsigned_long,_unsigned_long,_duckdb::ParquetCastOperator> *)
             &state_p[1].super_ColumnWriterState.definition_levels.
              super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&local_40);
  if (local_40.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_40.super__Function_base._M_manager)
              ((_Any_data *)&local_40,(_Any_data *)&local_40,__destroy_functor);
  }
  PrimitiveDictionary<unsigned_long,_unsigned_long,_duckdb::ParquetCastOperator>::
  GetTargetMemoryStream
            ((PrimitiveDictionary<unsigned_long,_unsigned_long,_duckdb::ParquetCastOperator> *)
             local_58);
  PrimitiveColumnWriter::WriteDictionary
            (&this->super_PrimitiveColumnWriter,state_p,
             (unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>,_true> *)
             local_58,(idx_t)state_p[1].super_ColumnWriterState.repetition_levels.
                             super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                             _M_impl.super__Vector_impl_data._M_finish);
  if ((__uniq_ptr_data<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>,_true,_true>)
      local_58._0_8_ !=
      (tuple<duckdb::MemoryStream_*,_std::default_delete<duckdb::MemoryStream>_>)0x0) {
    (**(code **)(*(long *)local_58._0_8_ + 0x10))();
  }
  return;
}

Assistant:

void FlushDictionary(PrimitiveColumnWriterState &state_p, ColumnWriterStatistics *stats) override {
		auto &state = state_p.Cast<StandardColumnWriterState<SRC, TGT, OP>>();
		D_ASSERT(state.encoding == duckdb_parquet::Encoding::RLE_DICTIONARY);

		state.bloom_filter =
		    make_uniq<ParquetBloomFilter>(state.dictionary.GetSize(), writer.BloomFilterFalsePositiveRatio());

		state.dictionary.IterateValues([&](const SRC &src_value, const TGT &tgt_value) {
			// update the statistics
			OP::template HandleStats<SRC, TGT>(stats, tgt_value);
			// update the bloom filter
			auto hash = OP::template XXHash64<SRC, TGT>(tgt_value);
			state.bloom_filter->FilterInsert(hash);
		});

		// flush the dictionary page and add it to the to-be-written pages
		WriteDictionary(state, state.dictionary.GetTargetMemoryStream(), state.dictionary.GetSize());
		// bloom filter will be queued for writing in ParquetWriter::BufferBloomFilter one level up
	}